

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase_tests.cpp
# Opt level: O2

void __thiscall netbase_tests::netbase_getgroup::test_method(netbase_getgroup *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  iterator pvVar2;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string file;
  initializer_list<unsigned_char> __l;
  const_string file_00;
  initializer_list<unsigned_char> __l_00;
  const_string file_01;
  initializer_list<unsigned_char> __l_01;
  const_string file_02;
  initializer_list<unsigned_char> __l_02;
  const_string file_03;
  initializer_list<unsigned_char> __l_03;
  const_string file_04;
  initializer_list<unsigned_char> __l_04;
  const_string file_05;
  initializer_list<unsigned_char> __l_05;
  const_string file_06;
  initializer_list<unsigned_char> __l_06;
  const_string file_07;
  initializer_list<unsigned_char> __l_07;
  const_string file_08;
  initializer_list<unsigned_char> __l_08;
  const_string file_09;
  initializer_list<unsigned_char> __l_09;
  initializer_list<unsigned_char> __l_10;
  const_string file_10;
  check_type cVar3;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  lazy_ostream local_168;
  undefined1 *local_158;
  char **local_150;
  allocator_type local_141;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_140;
  assertion_result local_128;
  vector<unsigned_char,_std::allocator<unsigned_char>_> internal_group;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  undefined4 local_d8;
  undefined2 local_d4;
  allocator<char> local_d1;
  _Bvector_base<std::allocator<bool>_> local_d0;
  _Bvector_base<std::allocator<bool>_> local_a8;
  string local_78;
  direct_or_indirect local_58 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_d0._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  local_d0._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ = 0;
  local_d0._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  local_d0._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ = 0;
  local_d0._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  local_a8._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  local_a8._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  local_a8._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  local_a8._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ = 0;
  local_d0._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  local_a8._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  local_a8._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  local_a8._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ = 0;
  local_d0._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_d0);
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x147;
  file.m_begin = (iterator)&local_e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f8,msg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"127.0.0.1",(allocator<char> *)&local_d8);
  ResolveIP((CNetAddr *)&local_58[0].indirect_contents,&local_78);
  NetGroupManager::GetGroup
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
             (NetGroupManager *)&local_a8,(CNetAddr *)&local_58[0].indirect_contents);
  local_d1 = (allocator<char>)0x0;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_d1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140,__l,&local_141);
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140);
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_150 = &local_178;
  local_178 = "netgroupman.GetGroup(ResolveIP(\"127.0.0.1\")) == std::vector<unsigned char>({0})";
  local_170 = "";
  local_168.m_empty = false;
  local_168._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_180 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&internal_group,&local_168,1,0,WARN,_cVar3,(size_t)&local_188,0x147
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_58[0].indirect_contents);
  std::__cxx11::string::~string((string *)&local_78);
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar2;
  msg_00.m_begin = pvVar1;
  file_00.m_end = (iterator)0x148;
  file_00.m_begin = (iterator)&local_198;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1a8,
             msg_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"257.0.0.1",(allocator<char> *)&local_d8);
  ResolveIP((CNetAddr *)&local_58[0].indirect_contents,&local_78);
  NetGroupManager::GetGroup
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
             (NetGroupManager *)&local_a8,(CNetAddr *)&local_58[0].indirect_contents);
  local_d1 = (allocator<char>)0x0;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_d1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140,__l_00,&local_141);
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140);
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178 = "netgroupman.GetGroup(ResolveIP(\"257.0.0.1\")) == std::vector<unsigned char>({0})";
  local_170 = "";
  local_168.m_empty = false;
  local_168._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = &local_178;
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_1b0 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&internal_group,&local_168,1,0,WARN,_cVar3,(size_t)&local_1b8,0x148
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_58[0].indirect_contents);
  std::__cxx11::string::~string((string *)&local_78);
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar2;
  msg_01.m_begin = pvVar1;
  file_01.m_end = (iterator)0x149;
  file_01.m_begin = (iterator)&local_1c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1d8,
             msg_01);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"10.0.0.1",(allocator<char> *)&local_d8);
  ResolveIP((CNetAddr *)&local_58[0].indirect_contents,&local_78);
  NetGroupManager::GetGroup
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
             (NetGroupManager *)&local_a8,(CNetAddr *)&local_58[0].indirect_contents);
  local_d1 = (allocator<char>)0x0;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_d1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140,__l_01,&local_141);
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140);
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178 = "netgroupman.GetGroup(ResolveIP(\"10.0.0.1\")) == std::vector<unsigned char>({0})";
  local_170 = "";
  local_168.m_empty = false;
  local_168._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = &local_178;
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_1e0 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&internal_group,&local_168,1,0,WARN,_cVar3,(size_t)&local_1e8,0x149
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_58[0].indirect_contents);
  std::__cxx11::string::~string((string *)&local_78);
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar2;
  msg_02.m_begin = pvVar1;
  file_02.m_end = (iterator)0x14a;
  file_02.m_begin = (iterator)&local_1f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_208,
             msg_02);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"169.254.1.1",(allocator<char> *)&local_d8);
  ResolveIP((CNetAddr *)&local_58[0].indirect_contents,&local_78);
  NetGroupManager::GetGroup
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
             (NetGroupManager *)&local_a8,(CNetAddr *)&local_58[0].indirect_contents);
  local_d1 = (allocator<char>)0x0;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&local_d1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140,__l_02,&local_141);
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140);
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178 = "netgroupman.GetGroup(ResolveIP(\"169.254.1.1\")) == std::vector<unsigned char>({0})";
  local_170 = "";
  local_168.m_empty = false;
  local_168._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = &local_178;
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_210 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&internal_group,&local_168,1,0,WARN,_cVar3,(size_t)&local_218,0x14a
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_58[0].indirect_contents);
  std::__cxx11::string::~string((string *)&local_78);
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar2;
  msg_03.m_begin = pvVar1;
  file_03.m_end = (iterator)0x14b;
  file_03.m_begin = (iterator)&local_228;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_238,
             msg_03);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"1.2.3.4",&local_d1);
  ResolveIP((CNetAddr *)&local_58[0].indirect_contents,&local_78);
  NetGroupManager::GetGroup
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
             (NetGroupManager *)&local_a8,(CNetAddr *)&local_58[0].indirect_contents);
  local_d8._0_3_ = 0x20101;
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)&local_d8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140,__l_03,&local_141);
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140);
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178 = 
  "netgroupman.GetGroup(ResolveIP(\"1.2.3.4\")) == std::vector<unsigned char>({(unsigned char)NET_IPV4, 1, 2})"
  ;
  local_170 = "";
  local_168.m_empty = false;
  local_168._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = &local_178;
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_240 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&internal_group,&local_168,1,0,WARN,_cVar3,(size_t)&local_248,0x14b
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_58[0].indirect_contents);
  std::__cxx11::string::~string((string *)&local_78);
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar2;
  msg_04.m_begin = pvVar1;
  file_04.m_end = (iterator)0x14c;
  file_04.m_begin = (iterator)&local_258;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_268,
             msg_04);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"::FFFF:0:102:304",&local_d1);
  ResolveIP((CNetAddr *)&local_58[0].indirect_contents,&local_78);
  NetGroupManager::GetGroup
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
             (NetGroupManager *)&local_a8,(CNetAddr *)&local_58[0].indirect_contents);
  local_d8._0_3_ = 0x20101;
  __l_04._M_len = 3;
  __l_04._M_array = (iterator)&local_d8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140,__l_04,&local_141);
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140);
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178 = 
  "netgroupman.GetGroup(ResolveIP(\"::FFFF:0:102:304\")) == std::vector<unsigned char>({(unsigned char)NET_IPV4, 1, 2})"
  ;
  local_170 = "";
  local_168.m_empty = false;
  local_168._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = &local_178;
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_270 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&internal_group,&local_168,1,0,WARN,_cVar3,(size_t)&local_278,0x14c
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_58[0].indirect_contents);
  std::__cxx11::string::~string((string *)&local_78);
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar2;
  msg_05.m_begin = pvVar1;
  file_05.m_end = (iterator)0x14d;
  file_05.m_begin = (iterator)&local_288;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_298,
             msg_05);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"64:FF9B::102:304",&local_d1);
  ResolveIP((CNetAddr *)&local_58[0].indirect_contents,&local_78);
  NetGroupManager::GetGroup
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
             (NetGroupManager *)&local_a8,(CNetAddr *)&local_58[0].indirect_contents);
  local_d8._0_3_ = 0x20101;
  __l_05._M_len = 3;
  __l_05._M_array = (iterator)&local_d8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140,__l_05,&local_141);
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140);
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178 = 
  "netgroupman.GetGroup(ResolveIP(\"64:FF9B::102:304\")) == std::vector<unsigned char>({(unsigned char)NET_IPV4, 1, 2})"
  ;
  local_170 = "";
  local_168.m_empty = false;
  local_168._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = &local_178;
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_2a0 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&internal_group,&local_168,1,0,WARN,_cVar3,(size_t)&local_2a8,0x14d
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_58[0].indirect_contents);
  std::__cxx11::string::~string((string *)&local_78);
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar2;
  msg_06.m_begin = pvVar1;
  file_06.m_end = (iterator)0x14e;
  file_06.m_begin = (iterator)&local_2b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2c8,
             msg_06);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"2002:102:304:9999:9999:9999:9999:9999",&local_d1);
  ResolveIP((CNetAddr *)&local_58[0].indirect_contents,&local_78);
  NetGroupManager::GetGroup
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
             (NetGroupManager *)&local_a8,(CNetAddr *)&local_58[0].indirect_contents);
  local_d8._0_3_ = 0x20101;
  __l_06._M_len = 3;
  __l_06._M_array = (iterator)&local_d8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140,__l_06,&local_141);
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140);
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178 = 
  "netgroupman.GetGroup(ResolveIP(\"2002:102:304:9999:9999:9999:9999:9999\")) == std::vector<unsigned char>({(unsigned char)NET_IPV4, 1, 2})"
  ;
  local_170 = "";
  local_168.m_empty = false;
  local_168._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = &local_178;
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_2d0 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&internal_group,&local_168,1,0,WARN,_cVar3,(size_t)&local_2d8,0x14e
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_58[0].indirect_contents);
  std::__cxx11::string::~string((string *)&local_78);
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar2;
  msg_07.m_begin = pvVar1;
  file_07.m_end = (iterator)0x14f;
  file_07.m_begin = (iterator)&local_2e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2f8,
             msg_07);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"2001:0:9999:9999:9999:9999:FEFD:FCFB",&local_d1);
  ResolveIP((CNetAddr *)&local_58[0].indirect_contents,&local_78);
  NetGroupManager::GetGroup
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
             (NetGroupManager *)&local_a8,(CNetAddr *)&local_58[0].indirect_contents);
  local_d8 = CONCAT13(local_d8._3_1_,0x20101);
  __l_07._M_len = 3;
  __l_07._M_array = (iterator)&local_d8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140,__l_07,&local_141);
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140);
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178 = 
  "netgroupman.GetGroup(ResolveIP(\"2001:0:9999:9999:9999:9999:FEFD:FCFB\")) == std::vector<unsigned char>({(unsigned char)NET_IPV4, 1, 2})"
  ;
  local_170 = "";
  local_168.m_empty = false;
  local_168._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = &local_178;
  local_308 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_300 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&internal_group,&local_168,1,0,WARN,_cVar3,(size_t)&local_308,0x14f
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_58[0].indirect_contents);
  std::__cxx11::string::~string((string *)&local_78);
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar2;
  msg_08.m_begin = pvVar1;
  file_08.m_end = (iterator)0x150;
  file_08.m_begin = (iterator)&local_318;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_328,
             msg_08);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"2001:470:abcd:9999:9999:9999:9999:9999",&local_d1);
  ResolveIP((CNetAddr *)&local_58[0].indirect_contents,&local_78);
  NetGroupManager::GetGroup
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
             (NetGroupManager *)&local_a8,(CNetAddr *)&local_58[0].indirect_contents);
  local_d8 = 0x4012002;
  local_d4 = 0xaf70;
  __l_08._M_len = 6;
  __l_08._M_array = (iterator)&local_d8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140,__l_08,&local_141);
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140);
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178 = 
  "netgroupman.GetGroup(ResolveIP(\"2001:470:abcd:9999:9999:9999:9999:9999\")) == std::vector<unsigned char>({(unsigned char)NET_IPV6, 32, 1, 4, 112, 175})"
  ;
  local_170 = "";
  local_168.m_empty = false;
  local_168._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = &local_178;
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_330 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&internal_group,&local_168,1,0,WARN,_cVar3,(size_t)&local_338,0x150
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_58[0].indirect_contents);
  std::__cxx11::string::~string((string *)&local_78);
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar2;
  msg_09.m_begin = pvVar1;
  file_09.m_end = (iterator)0x151;
  file_09.m_begin = (iterator)&local_348;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_358,
             msg_09);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"2001:2001:9999:9999:9999:9999:9999:9999",&local_d1);
  ResolveIP((CNetAddr *)&local_58[0].indirect_contents,&local_78);
  NetGroupManager::GetGroup
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
             (NetGroupManager *)&local_a8,(CNetAddr *)&local_58[0].indirect_contents);
  local_d8 = 0x20012002;
  local_d4 = CONCAT11(local_d4._1_1_,1);
  __l_09._M_len = 5;
  __l_09._M_array = (iterator)&local_d8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140,__l_09,&local_141);
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140);
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178 = 
  "netgroupman.GetGroup(ResolveIP(\"2001:2001:9999:9999:9999:9999:9999:9999\")) == std::vector<unsigned char>({(unsigned char)NET_IPV6, 32, 1, 32, 1})"
  ;
  local_170 = "";
  local_168.m_empty = false;
  local_168._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = &local_178;
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_360 = "";
  pvVar1 = &DAT_00000001;
  pvVar2 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&internal_group,&local_168,1,0,WARN,_cVar3,(size_t)&local_368,0x151
            );
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_58[0].indirect_contents);
  std::__cxx11::string::~string((string *)&local_78);
  local_58[0].indirect_contents.indirect = (char *)0x746eb0094921206;
  local_58[0].indirect_contents.capacity._0_2_ = 0xacc4;
  local_58[0].direct[10] = '\a';
  __l_10._M_len = 0xb;
  __l_10._M_array = (iterator)local_58;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&internal_group,__l_10,(allocator_type *)&local_78);
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = pvVar2;
  msg_10.m_begin = pvVar1;
  file_10.m_end = (iterator)0x155;
  file_10.m_begin = (iterator)&local_378;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_388,
             msg_10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"baz.net",(allocator<char> *)&local_d8);
  CreateInternal((CNetAddr *)&local_58[0].indirect_contents,&local_78);
  NetGroupManager::GetGroup
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140,
             (NetGroupManager *)&local_a8,(CNetAddr *)&local_58[0].indirect_contents);
  local_128.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140,
                       &internal_group);
  local_128.m_message.px = (element_type *)0x0;
  local_128.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_178 = "netgroupman.GetGroup(CreateInternal(\"baz.net\")) == internal_group";
  local_170 = "";
  local_168.m_empty = false;
  local_168._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = &local_178;
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/netbase_tests.cpp"
  ;
  local_390 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_128,&local_168,1,0,WARN,_cVar3,(size_t)&local_398,0x155);
  boost::detail::shared_count::~shared_count(&local_128.m_message.pn);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_58[0].indirect_contents);
  std::__cxx11::string::~string((string *)&local_78);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&internal_group.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(netbase_getgroup)
{
    NetGroupManager netgroupman{std::vector<bool>()}; // use /16
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("127.0.0.1")) == std::vector<unsigned char>({0})); // Local -> !Routable()
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("257.0.0.1")) == std::vector<unsigned char>({0})); // !Valid -> !Routable()
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("10.0.0.1")) == std::vector<unsigned char>({0})); // RFC1918 -> !Routable()
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("169.254.1.1")) == std::vector<unsigned char>({0})); // RFC3927 -> !Routable()
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("1.2.3.4")) == std::vector<unsigned char>({(unsigned char)NET_IPV4, 1, 2})); // IPv4
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("::FFFF:0:102:304")) == std::vector<unsigned char>({(unsigned char)NET_IPV4, 1, 2})); // RFC6145
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("64:FF9B::102:304")) == std::vector<unsigned char>({(unsigned char)NET_IPV4, 1, 2})); // RFC6052
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("2002:102:304:9999:9999:9999:9999:9999")) == std::vector<unsigned char>({(unsigned char)NET_IPV4, 1, 2})); // RFC3964
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("2001:0:9999:9999:9999:9999:FEFD:FCFB")) == std::vector<unsigned char>({(unsigned char)NET_IPV4, 1, 2})); // RFC4380
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("2001:470:abcd:9999:9999:9999:9999:9999")) == std::vector<unsigned char>({(unsigned char)NET_IPV6, 32, 1, 4, 112, 175})); //he.net
    BOOST_CHECK(netgroupman.GetGroup(ResolveIP("2001:2001:9999:9999:9999:9999:9999:9999")) == std::vector<unsigned char>({(unsigned char)NET_IPV6, 32, 1, 32, 1})); //IPv6

    // baz.net sha256 hash: 12929400eb4607c4ac075f087167e75286b179c693eb059a01774b864e8fe505
    std::vector<unsigned char> internal_group = {NET_INTERNAL, 0x12, 0x92, 0x94, 0x00, 0xeb, 0x46, 0x07, 0xc4, 0xac, 0x07};
    BOOST_CHECK(netgroupman.GetGroup(CreateInternal("baz.net")) == internal_group);
}